

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

String * __thiscall
capnp::compiler::CompilerMain::getDisplayName
          (String *__return_storage_ptr__,CompilerMain *this,ReadableDirectory *dir,PathPtr path)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  String *params_1;
  bool absolute;
  PathPtr path_local;
  Fault f;
  
  path_local.parts.size_ = path.parts.size_;
  params_1 = path.parts.ptr;
  path_local.parts.ptr = params_1;
  kj::HashMap<kj::ReadableDirectory_const*,kj::String>::find<kj::ReadableDirectory_const*>
            ((HashMap<kj::ReadableDirectory_const*,kj::String> *)&f,
             (ReadableDirectory **)&this->dirPrefixes);
  if (f.exception == (Exception *)0x0) {
    iVar1 = (**((this->disk).ptr)->_vptr_Filesystem)();
    if ((ReadableDirectory *)CONCAT44(extraout_var,iVar1) == dir) {
      absolute = true;
    }
    else {
      iVar1 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
      if ((ReadableDirectory *)CONCAT44(extraout_var_00,iVar1) != dir) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                   ,0x7e7,FAILED,(char *)0x0,"\"unrecognized directory\"",
                   (char (*) [23])"unrecognized directory");
        kj::_::Debug::Fault::fatal(&f);
      }
      absolute = false;
    }
    kj::PathPtr::toString(__return_storage_ptr__,&path_local,absolute);
  }
  else {
    kj::PathPtr::toString((String *)&f,&path_local,false);
    kj::str<kj::String&,kj::String>(__return_storage_ptr__,(kj *)f.exception,(String *)&f,params_1);
    kj::Array<char>::~Array((Array<char> *)&f);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String getDisplayName(const kj::ReadableDirectory& dir, kj::PathPtr path) {
    KJ_IF_SOME(prefix, dirPrefixes.find(&dir)) {
      return kj::str(prefix, path.toNativeString());
    } else if (&dir == &disk->getRoot()) {
      return path.toNativeString(true);
    } else if (&dir == &disk->getCurrent()) {
      return path.toNativeString(false);
    } else {
      KJ_FAIL_ASSERT("unrecognized directory");
    }
  }
};

}